

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmsrcf.cpp
# Opt level: O1

void __thiscall CVmSrcfEntry::add_line_record(CVmSrcfEntry *this,ulong linenum,ulong code_addr)

{
  if ((this->lines_alo_ <= this->lines_cnt_) &&
     (alloc_line_records(this,this->lines_alo_ + 0x400), this->lines_alo_ <= this->lines_cnt_)) {
    return;
  }
  this->lines_[this->lines_cnt_].linenum = linenum;
  this->lines_[this->lines_cnt_].code_addr = code_addr;
  this->lines_cnt_ = this->lines_cnt_ + 1;
  return;
}

Assistant:

void CVmSrcfEntry::add_line_record(ulong linenum, ulong code_addr)
{
    /* make sure we have enough space */
    if (lines_cnt_ >= lines_alo_)
    {
        /* expand the line records array */
        alloc_line_records(lines_alo_ + 1024);

        /* if that didn't create enough space, ignore the new record */
        if (lines_cnt_ >= lines_alo_)
            return;
    }

    /* add the new record */
    lines_[lines_cnt_].linenum = linenum;
    lines_[lines_cnt_].code_addr = code_addr;

    /* count the new record */
    ++lines_cnt_;
}